

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_write_keys_histoe
              (fitsfile *fptr,fitsfile *histptr,int naxis,int *colnum,char (*colname) [71],
              char **colexpr,int *status)

{
  undefined8 local_f0;
  double dvalue;
  char svalue [71];
  char local_98 [8];
  char keyname [75];
  int local_44;
  int tstatus;
  int ii;
  char **colexpr_local;
  char (*colname_local) [71];
  int *colnum_local;
  int naxis_local;
  fitsfile *histptr_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    for (local_44 = 0; local_44 < naxis; local_44 = local_44 + 1) {
      stack0xffffffffffffffb8 = 0;
      if ((((colexpr == (char **)0x0) || (colexpr[local_44] == (char *)0x0)) ||
          (*colexpr[local_44] == '\0')) || (colname + local_44 == (char (*) [71])0x0)) {
        stack0xffffffffffffffb8 = 0;
        ffkeyn("CTYPE",local_44 + 1,local_98,(int *)(keyname + 0x48));
        ffgky(histptr,0x10,local_98,&dvalue,(char *)0x0,(int *)(keyname + 0x48));
        if (stack0xffffffffffffffb8 != 0) {
          stack0xffffffffffffffb8 = 0;
          ffkeyn("TTYPE",colnum[local_44],local_98,(int *)(keyname + 0x48));
          ffgky(fptr,0x10,local_98,&dvalue,(char *)0x0,(int *)(keyname + 0x48));
          if (stack0xffffffffffffffb8 == 0) {
            ffkeyn("CTYPE",local_44 + 1,local_98,(int *)(keyname + 0x48));
            ffpky(histptr,0x10,local_98,&dvalue,"Coordinate Type",(int *)(keyname + 0x48));
          }
          stack0xffffffffffffffb8 = 0;
          ffkeyn("TUNIT",colnum[local_44],local_98,(int *)(keyname + 0x48));
          ffgky(fptr,0x10,local_98,&dvalue,(char *)0x0,(int *)(keyname + 0x48));
          if (stack0xffffffffffffffb8 == 0) {
            ffkeyn("CUNIT",local_44 + 1,local_98,(int *)(keyname + 0x48));
            ffpky(histptr,0x10,local_98,&dvalue,"Coordinate Units",(int *)(keyname + 0x48));
          }
          goto LAB_0021d7a1;
        }
      }
      else {
        ffkeyn("CTYPE",local_44 + 1,local_98,(int *)(keyname + 0x48));
        ffpky(histptr,0x10,local_98,colname + local_44,"Coordinate Type",(int *)(keyname + 0x48));
LAB_0021d7a1:
        local_f0 = 0x3ff0000000000000;
        stack0xffffffffffffffb8 = 0;
        ffkeyn("CRPIX",local_44 + 1,local_98,(int *)(keyname + 0x48));
        ffpky(histptr,0x52,local_98,&local_f0,"Reference Pixel",(int *)(keyname + 0x48));
        local_f0 = 0x3ff0000000000000;
        stack0xffffffffffffffb8 = 0;
        ffkeyn("CRVAL",local_44 + 1,local_98,(int *)(keyname + 0x48));
        ffpky(histptr,0x52,local_98,&local_f0,"Reference Value",(int *)(keyname + 0x48));
        stack0xffffffffffffffb8 = 0;
        local_f0 = 0x3ff0000000000000;
        ffkeyn("CDELT",local_44 + 1,local_98,(int *)(keyname + 0x48));
        ffpky(histptr,0x52,local_98,&local_f0,"Pixel size",(int *)(keyname + 0x48));
      }
    }
    fptr_local._4_4_ = *status;
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int fits_write_keys_histoe(
      fitsfile *fptr,   /* I - pointer to table to be binned              */
      fitsfile *histptr,  /* I - pointer to output histogram image HDU      */
      int naxis,        /* I - number of axes in the histogram image      */
      int *colnum,      /* I - column numbers (array length = naxis)      */
      char colname[4][FLEN_VALUE], /* I - if expression, then column name to use */
      char *colexpr[4], /* I - if expression, then column name to use */
      int *status)     
{      
   /*  Write default WCS keywords in the output histogram image header */
   /*  if the keywords do not already exist.   */

    int ii, tstatus;
    char keyname[FLEN_KEYWORD], svalue[FLEN_VALUE];
    double dvalue;
    
    if (*status > 0)
        return(*status);

    for (ii = 0; ii < naxis; ii++)
    {
       /*  CTYPEn  */
       tstatus = 0;

       if (colexpr && colexpr[ii] && colexpr[ii][0] && colname[ii]) 
       {
	 /* Column expression: we need to put the column name from the binning expression */
         ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
         ffpky(histptr, TSTRING, keyname, colname[ii], "Coordinate Type", &tstatus);
       }
       else
       {
	 /* Column name */
	 tstatus = 0;
	 ffkeyn("CTYPE", ii+1, keyname, &tstatus);
	 ffgky(histptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus) continue;  /* keyword already exists, so skip to next axis */

	 /* use column name as the axis name */
	 tstatus = 0;
	 ffkeyn("TTYPE", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
	   }
	 
	 /*  CUNITn,  use the column units */
	 tstatus = 0;
	 ffkeyn("TUNIT", colnum[ii], keyname, &tstatus);
	 ffgky(fptr, TSTRING, keyname, svalue, NULL, &tstatus);
	 
	 if (!tstatus)
	   {
	     ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
	     ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
	   }
       }

       /*  CRPIXn  - Reference Pixel choose first pixel in new image as ref. pix. */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

       /*  CRVALn - Value at the location of the reference pixel */
       dvalue = 1.0;
       tstatus = 0;
       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

       /*  CDELTn - unit size of pixels  */
       dvalue = 1.0;  
       tstatus = 0;
       dvalue = 1.;
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

    }
    return(*status);
}